

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TuningsImpl.h
# Opt level: O3

KeyboardMapping *
Tunings::startScaleOnAndTuneNoteTo
          (KeyboardMapping *__return_storage_ptr__,int scaleStart,int midiNote,double freq)

{
  ostream *poVar1;
  ostringstream oss;
  locale local_340 [8];
  long *local_338 [2];
  long local_328 [2];
  locale local_318 [120];
  ios_base local_2a0 [264];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::locale::locale(local_318,"C");
  std::ios::imbue(local_340);
  std::locale::~locale(local_340);
  std::locale::~locale(local_318);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"! Automatically generated mapping, tuning note ",0x2f);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)local_198,midiNote);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," to ",4);
  poVar1 = std::ostream::_M_insert<double>(freq);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," Hz\n",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"!\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"! Size of map\n",0xe);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"! First and last MIDI notes to map - map the entire keyboard\n",0x3d);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x7f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"! Middle note where the first entry in the scale is mapped.\n",0x3c);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,scaleStart);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"! Reference note where frequency is fixed\n",0x2a);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,midiNote);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"! Frequency for MIDI note ",0x1a);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,midiNote);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  poVar1 = std::ostream::_M_insert<double>(freq);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"! Scale degree for formal octave. This is an empty mapping, so:\n",0x40);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"! Mapping. This is an empty mapping so list no keys\n",0x34);
  std::__cxx11::stringbuf::str();
  std::__cxx11::istringstream::istringstream((istringstream *)local_318,(string *)local_338,_S_in);
  readKBMStream(__return_storage_ptr__,(istream *)local_318);
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->name,0,
             (char *)(__return_storage_ptr__->name)._M_string_length,0x1051e0);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_318);
  std::ios_base::~ios_base(local_2a0);
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

inline KeyboardMapping startScaleOnAndTuneNoteTo(int scaleStart, int midiNote, double freq)
{
    std::ostringstream oss;
    oss.imbue(std::locale("C"));
    oss << "! Automatically generated mapping, tuning note " << midiNote << " to " << freq
        << " Hz\n"
        << "!\n"
        << "! Size of map\n"
        << 0 << "\n"
        << "! First and last MIDI notes to map - map the entire keyboard\n"
        << 0 << "\n"
        << 127 << "\n"
        << "! Middle note where the first entry in the scale is mapped.\n"
        << scaleStart << "\n"
        << "! Reference note where frequency is fixed\n"
        << midiNote << "\n"
        << "! Frequency for MIDI note " << midiNote << "\n"
        << freq << "\n"
        << "! Scale degree for formal octave. This is an empty mapping, so:\n"
        << 0 << "\n"
        << "! Mapping. This is an empty mapping so list no keys\n";

    return parseKBMData(oss.str());
}